

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

char * soplex::
       getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *p_lp,int p_idx,NameSet *p_cnames,char *p_buf)

{
  bool bVar1;
  DataKey this;
  char *pcVar2;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RCX;
  long in_RDX;
  uint in_ESI;
  DataKey key;
  undefined8 in_stack_ffffffffffffffd0;
  DataKey this_00;
  
  if (in_RDX != 0) {
    this = (DataKey)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::cId(in_RCX,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    this_00 = this;
    bVar1 = NameSet::has((NameSet *)this,(DataKey *)this);
    if (bVar1) {
      pcVar2 = NameSet::operator[]((NameSet *)this_00,(DataKey *)this);
      return pcVar2;
    }
  }
  spxSnprintf((char *)in_RCX,0x10,"x%d",(ulong)in_ESI);
  return (char *)in_RCX;
}

Assistant:

static const char* getColName(
   const SPxLPBase<R>& p_lp,
   int                    p_idx,
   const NameSet*         p_cnames,
   char*                  p_buf
)
{
   assert(p_buf != nullptr);
   assert(p_idx >= 0);
   assert(p_idx <  p_lp.nCols());

   if(p_cnames != nullptr)
   {
      DataKey key = p_lp.cId(p_idx);

      if(p_cnames->has(key))
         return (*p_cnames)[key];
   }

   spxSnprintf(p_buf, 16, "x%d", p_idx);

   return p_buf;
}